

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveResourceLayout
               (PipelineResourceLayoutDesc *SrcLayout,FixedLinearAllocator *MemPool)

{
  Char *pCVar1;
  Uint32 i;
  ulong uVar2;
  long lVar3;
  string msg;
  
  if (SrcLayout->Variables != (ShaderResourceVariableDesc *)0x0) {
    FixedLinearAllocator::AddSpace<Diligent::ShaderResourceVariableDesc>
              (MemPool,(ulong)SrcLayout->NumVariables);
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < SrcLayout->NumVariables; uVar2 = uVar2 + 1) {
      pCVar1 = *(Char **)((long)&SrcLayout->Variables->Name + lVar3);
      if (pCVar1 == (Char *)0x0) {
        FormatString<char[28]>(&msg,(char (*) [28])"Variable name can\'t be null");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"ReserveResourceLayout",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x49b);
        std::__cxx11::string::~string((string *)&msg);
        pCVar1 = *(Char **)((long)&SrcLayout->Variables->Name + lVar3);
      }
      FixedLinearAllocator::AddSpaceForString(MemPool,pCVar1,0);
      lVar3 = lVar3 + 0x10;
    }
  }
  if (SrcLayout->ImmutableSamplers != (ImmutableSamplerDesc *)0x0) {
    FixedLinearAllocator::AddSpace<Diligent::ImmutableSamplerDesc>
              (MemPool,(ulong)SrcLayout->NumImmutableSamplers);
    lVar3 = 8;
    for (uVar2 = 0; uVar2 < SrcLayout->NumImmutableSamplers; uVar2 = uVar2 + 1) {
      pCVar1 = *(Char **)((long)(SrcLayout->ImmutableSamplers->Desc).BorderColor + lVar3 + -0x2c);
      if (pCVar1 == (Char *)0x0) {
        FormatString<char[48]>
                  (&msg,(char (*) [48])"Immutable sampler or texture name can\'t be null");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"ReserveResourceLayout",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x4a5);
        std::__cxx11::string::~string((string *)&msg);
        pCVar1 = *(Char **)((long)(SrcLayout->ImmutableSamplers->Desc).BorderColor + lVar3 + -0x2c);
      }
      FixedLinearAllocator::AddSpaceForString(MemPool,pCVar1,0);
      lVar3 = lVar3 + 0x48;
    }
  }
  return;
}

Assistant:

static void ReserveResourceLayout(const PipelineResourceLayoutDesc& SrcLayout, FixedLinearAllocator& MemPool) noexcept
    {
        if (SrcLayout.Variables != nullptr)
        {
            MemPool.AddSpace<ShaderResourceVariableDesc>(SrcLayout.NumVariables);
            for (Uint32 i = 0; i < SrcLayout.NumVariables; ++i)
            {
                VERIFY(SrcLayout.Variables[i].Name != nullptr, "Variable name can't be null");
                MemPool.AddSpaceForString(SrcLayout.Variables[i].Name);
            }
        }

        if (SrcLayout.ImmutableSamplers != nullptr)
        {
            MemPool.AddSpace<ImmutableSamplerDesc>(SrcLayout.NumImmutableSamplers);
            for (Uint32 i = 0; i < SrcLayout.NumImmutableSamplers; ++i)
            {
                VERIFY(SrcLayout.ImmutableSamplers[i].SamplerOrTextureName != nullptr, "Immutable sampler or texture name can't be null");
                MemPool.AddSpaceForString(SrcLayout.ImmutableSamplers[i].SamplerOrTextureName);
            }
        }

        static_assert(std::is_trivially_destructible<decltype(*SrcLayout.Variables)>::value, "Add destructor for this object to Destruct()");
        static_assert(std::is_trivially_destructible<decltype(*SrcLayout.ImmutableSamplers)>::value, "Add destructor for this object to Destruct()");
    }